

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitStructGet(BinaryInstWriter *this,StructGet *curr)

{
  MemoryOrder MVar1;
  pointer pFVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar3;
  uint uVar4;
  Struct *pSVar5;
  ulong uVar6;
  size_t __n;
  void *__buf;
  void *__buf_00;
  uint uVar7;
  HeapType local_40;
  LEB<unsigned_int,_unsigned_char> local_34;
  
  bVar3 = wasm::Type::isNull(&curr->ref->type);
  if (bVar3) {
    local_40.id = local_40.id & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)&local_40);
  }
  else {
    local_40 = wasm::Type::getHeapType(&curr->ref->type);
    pSVar5 = HeapType::getStruct(&local_40);
    uVar6 = (ulong)curr->index;
    MVar1 = curr->order;
    pFVar2 = (pSVar5->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n = uVar6 * 0x10;
    if ((pFVar2[uVar6].type.id == 2) && (pFVar2[uVar6].packedType != not_packed)) {
      if (curr->signed_ == true) {
        uVar4 = 3;
        uVar7 = 0x5d;
      }
      else {
        uVar4 = 4;
        uVar7 = 0x5e;
      }
    }
    else {
      uVar4 = 2;
      uVar7 = 0x5c;
    }
    if (MVar1 == Unordered) {
      uVar7 = uVar4;
    }
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_34.value._0_1_ = (MVar1 != Unordered) * '\x03' + -5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)&local_34);
    local_34.value = uVar7;
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this_00,__buf,__n);
    if (MVar1 != Unordered) {
      WasmBinaryWriter::writeMemoryOrder(this->parent,curr->order,false);
    }
    WasmBinaryWriter::writeIndexedHeapType(this->parent,local_40);
    local_34.value = curr->index;
    LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_00,__n);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStructGet(StructGet* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  const auto& heapType = curr->ref->type.getHeapType();
  const auto& field = heapType.getStruct().fields[curr->index];
  bool atomic = curr->order != MemoryOrder::Unordered;
  int8_t op;
  if (field.type != Type::i32 || field.packedType == Field::not_packed) {
    op = atomic ? BinaryConsts::StructAtomicGet : BinaryConsts::StructGet;
  } else if (curr->signed_) {
    op = atomic ? BinaryConsts::StructAtomicGetS : BinaryConsts::StructGetS;
  } else {
    op = atomic ? BinaryConsts::StructAtomicGetU : BinaryConsts::StructGetU;
  }
  auto prefix = atomic ? BinaryConsts::AtomicPrefix : BinaryConsts::GCPrefix;
  o << int8_t(prefix) << U32LEB(op);
  if (atomic) {
    parent.writeMemoryOrder(curr->order);
  }
  parent.writeIndexedHeapType(heapType);
  o << U32LEB(curr->index);
}